

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.h
# Opt level: O2

int aom_read_literal_(aom_reader *r,int bits)

{
  int iVar1;
  int literal;
  uint uVar2;
  
  uVar2 = 0;
  while (0 < bits) {
    bits = bits + -1;
    iVar1 = aom_read_bit_(r);
    uVar2 = uVar2 | iVar1 << ((byte)bits & 0x1f);
  }
  return uVar2;
}

Assistant:

static inline int aom_read_literal_(aom_reader *r, int bits ACCT_STR_PARAM) {
  int literal = 0, bit;

  for (bit = bits - 1; bit >= 0; bit--) literal |= aom_read_bit(r, NULL) << bit;
#if CONFIG_ACCOUNTING
  if (ACCT_STR_NAME) aom_process_accounting(r, ACCT_STR_NAME);
#endif
  return literal;
}